

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

void PairSearchHelper(ON_RTreeNode *a_nodeA,ON_RTreeNode *a_nodeB,
                     ON_RTreePairSearchCallbackResult *a_result)

{
  ON_RTreeBranch *a_branchB;
  int iVar1;
  int iVar2;
  bool bVar3;
  ON_RTreeBranch *a_branchA;
  anon_union_8_2_fca59aa2_for_ON_RTreeBranch_1 *paVar4;
  
  iVar1 = a_nodeA->m_count;
  iVar2 = a_nodeB->m_count;
  for (a_branchA = a_nodeA->m_branch; paVar4 = &a_nodeB->m_branch[0].field_1,
      a_branchA < a_nodeA->m_branch + iVar1; a_branchA = a_branchA + 1) {
    for (; a_branchB = (ON_RTreeBranch *)(paVar4 + -6), a_branchB < a_nodeB->m_branch + iVar2;
        paVar4 = paVar4 + 7) {
      bVar3 = PairSearchOverlapHelper
                        (&a_branchA->m_rect,(ON_RTreeBBox *)a_branchB,a_result->m_tolerance);
      if (bVar3) {
        if (a_nodeA->m_level < 1) {
          if (a_nodeB->m_level < 1) {
            (*a_result->m_resultCallback)
                      (a_result->m_context,(ON__INT_PTR)(a_branchA->field_1).m_child,
                       (ON__INT_PTR)paVar4->m_child);
          }
          else {
            PairSearchHelper(a_branchA,paVar4->m_child,a_result);
          }
        }
        else if (a_nodeB->m_level < 1) {
          PairSearchHelper((a_branchA->field_1).m_child,a_branchB,a_result);
        }
        else {
          PairSearchHelper((a_branchA->field_1).m_child,paVar4->m_child,a_result);
        }
      }
    }
  }
  return;
}

Assistant:

static void PairSearchHelper( const ON_RTreeNode* a_nodeA, const ON_RTreeNode* a_nodeB, ON_RTreePairSearchCallbackResult* a_result )
{
  // DO NOT ADD ANYTHING TO THIS FUNCTION
  const ON_RTreeBranch *branchA, *branchAmax, *branchB, *branchBmax;

  branchA = a_nodeA->m_branch;
  branchAmax = branchA + a_nodeA->m_count;
  branchBmax = a_nodeB->m_branch + a_nodeB->m_count;
  while(branchA < branchAmax)
  {
    for ( branchB = a_nodeB->m_branch; branchB < branchBmax; branchB++ )
    {
      if ( PairSearchOverlapHelper( &branchA->m_rect, &branchB->m_rect, a_result->m_tolerance ) )
      {
        if ( a_nodeA->m_level > 0 )
        {
          if ( a_nodeB->m_level > 0 )
            PairSearchHelper(branchA->m_child,branchB->m_child,a_result);
          else
            PairSearchHelper(branchA->m_child,branchB,a_result);
        }
        else if ( a_nodeB->m_level > 0 )
        {
          PairSearchHelper(branchA,branchB->m_child,a_result);
        }
        else
        {
          a_result->m_resultCallback(a_result->m_context,branchA->m_id,branchB->m_id);
        }
      }
    }
    branchA++;
  }
}